

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_compress.cpp
# Opt level: O3

size_t __thiscall
duckdb_zstd::ZSTD_compressBegin_usingCDict_internal
          (duckdb_zstd *this,ZSTD_CCtx *cctx,ZSTD_CDict *cdict,ZSTD_frameParameters fParams,
          unsigned_long_long pledgedSrcSize)

{
  uint uVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  undefined4 uVar5;
  undefined4 uVar6;
  undefined8 uVar7;
  undefined4 uVar8;
  undefined4 uVar9;
  undefined4 uVar10;
  undefined4 uVar11;
  undefined4 uVar12;
  undefined4 uVar13;
  undefined4 uVar14;
  uint uVar15;
  size_t sVar17;
  ulong srcSizeHint;
  int compressionLevel;
  ZSTD_CCtx_params cctxParams;
  undefined1 local_108 [40];
  int local_e0;
  int local_dc;
  ZSTD_paramSwitch_e local_a8;
  ZSTD_paramSwitch_e local_7c;
  ZSTD_paramSwitch_e local_78;
  size_t local_40;
  ZSTD_paramSwitch_e local_38;
  ulong uVar16;
  
  srcSizeHint = CONCAT44((int)((ulong)register0x00000080 >> 0x20),fParams.noDictIDFlag);
  if (cctx == (ZSTD_CCtx *)0x0) {
    return 0xffffffffffffffe0;
  }
  if ((((srcSizeHint < 0x20000) || (srcSizeHint == 0xffffffffffffffff)) ||
      (srcSizeHint < *(size_t *)&cctx->bmi2 * 6)) ||
     (compressionLevel = *(int *)((long)&cctx[1].xxhState.v4 + 4), compressionLevel == 0)) {
    uVar2 = (cctx->appliedParams).outBufferMode;
    uVar3 = (cctx->appliedParams).blockDelimiters;
    uVar4 = (cctx->appliedParams).validateSequences;
    uVar5 = (cctx->appliedParams).useBlockSplitter;
    uVar6 = (cctx->appliedParams).useRowMatchFinder;
    uVar7 = *(undefined8 *)&(cctx->appliedParams).deterministicRefPrefix;
    local_108._20_4_ = (undefined4)uVar7;
    local_108._24_4_ = (undefined4)((ulong)uVar7 >> 0x20);
    compressionLevel = *(int *)((long)&cctx[1].xxhState.v4 + 4);
    local_108._0_4_ = uVar2;
    local_108._4_4_ = uVar3;
    local_108._8_4_ = uVar4;
    local_108._12_4_ = uVar5;
    local_108._16_4_ = uVar6;
  }
  else {
    ZSTD_getCParams_internal
              ((ZSTD_compressionParameters *)local_108,compressionLevel,srcSizeHint,
               *(size_t *)&cctx->bmi2,ZSTD_cpm_unknown);
  }
  uVar14 = local_108._24_4_;
  uVar13 = local_108._20_4_;
  uVar12 = local_108._16_4_;
  uVar11 = local_108._12_4_;
  uVar10 = local_108._8_4_;
  uVar9 = local_108._4_4_;
  uVar8 = local_108._0_4_;
  memset((ZSTD_CCtx_params *)local_108,0,0xd8);
  local_108._4_4_ = uVar8;
  local_108._8_4_ = uVar9;
  local_108._12_4_ = uVar10;
  local_108._16_4_ = uVar11;
  local_108._20_4_ = uVar12;
  local_108._24_4_ = uVar13;
  local_108._28_4_ = uVar14;
  if (uVar14 - ZSTD_btlazy2 < 0xfffffffd) {
    local_78 = ZSTD_ps_disable;
    if ((int)uVar14 < 7) {
      local_7c = ZSTD_ps_disable;
      local_a8 = ZSTD_ps_disable;
    }
    else {
      local_7c = ((uint)uVar8 < 0x11) + ZSTD_ps_enable;
      local_a8 = ((uint)uVar8 < 0x1b) + ZSTD_ps_enable;
    }
  }
  else {
    local_78 = ((uint)uVar8 < 0xf) + ZSTD_ps_enable;
    local_7c = ZSTD_ps_disable;
    local_a8 = ZSTD_ps_disable;
  }
  local_40 = 0x20000;
  local_38 = (compressionLevel < 10) + ZSTD_ps_enable;
  if (srcSizeHint == 0xffffffffffffffff) {
    srcSizeHint = 0xffffffffffffffff;
  }
  else {
    local_108._4_4_ = ZSTD_f_zstd1_magicless;
    if (1 < srcSizeHint) {
      uVar16 = 0x80000;
      if (srcSizeHint < 0x80000) {
        uVar16 = srcSizeHint;
      }
      uVar15 = (int)uVar16 - 1;
      uVar1 = 0x1f;
      if (uVar15 != 0) {
        for (; uVar15 >> uVar1 == 0; uVar1 = uVar1 - 1) {
        }
      }
      local_108._4_4_ = (uVar1 ^ 0xffffffe0) + 0x21;
    }
    if ((uint)local_108._4_4_ < (uint)uVar8) {
      local_108._4_4_ = uVar8;
    }
  }
  local_108._32_8_ = cdict;
  local_e0 = fParams.contentSizeFlag;
  local_dc = compressionLevel;
  sVar17 = ZSTD_compressBegin_internal
                     ((ZSTD_CCtx *)this,(void *)0x0,0,ZSTD_dct_auto,ZSTD_dtlm_fast,
                      (ZSTD_CDict *)cctx,(ZSTD_CCtx_params *)local_108,srcSizeHint,
                      ZSTDb_not_buffered);
  return sVar17;
}

Assistant:

static size_t ZSTD_compressBegin_usingCDict_internal(
    ZSTD_CCtx* const cctx, const ZSTD_CDict* const cdict,
    ZSTD_frameParameters const fParams, unsigned long long const pledgedSrcSize)
{
    ZSTD_CCtx_params cctxParams;
    DEBUGLOG(4, "ZSTD_compressBegin_usingCDict_internal");
    RETURN_ERROR_IF(cdict==NULL, dictionary_wrong, "NULL pointer!");
    /* Initialize the cctxParams from the cdict */
    {
        ZSTD_parameters params;
        params.fParams = fParams;
        params.cParams = ( pledgedSrcSize < ZSTD_USE_CDICT_PARAMS_SRCSIZE_CUTOFF
                        || pledgedSrcSize < cdict->dictContentSize * ZSTD_USE_CDICT_PARAMS_DICTSIZE_MULTIPLIER
                        || pledgedSrcSize == ZSTD_CONTENTSIZE_UNKNOWN
                        || cdict->compressionLevel == 0 ) ?
                ZSTD_getCParamsFromCDict(cdict)
              : ZSTD_getCParams(cdict->compressionLevel,
                                pledgedSrcSize,
                                cdict->dictContentSize);
        ZSTD_CCtxParams_init_internal(&cctxParams, &params, cdict->compressionLevel);
    }
    /* Increase window log to fit the entire dictionary and source if the
     * source size is known. Limit the increase to 19, which is the
     * window log for compression level 1 with the largest source size.
     */
    if (pledgedSrcSize != ZSTD_CONTENTSIZE_UNKNOWN) {
        U32 const limitedSrcSize = (U32)MIN(pledgedSrcSize, 1U << 19);
        U32 const limitedSrcLog = limitedSrcSize > 1 ? ZSTD_highbit32(limitedSrcSize - 1) + 1 : 1;
        cctxParams.cParams.windowLog = MAX(cctxParams.cParams.windowLog, limitedSrcLog);
    }
    return ZSTD_compressBegin_internal(cctx,
                                        NULL, 0, ZSTD_dct_auto, ZSTD_dtlm_fast,
                                        cdict,
                                        &cctxParams, pledgedSrcSize,
                                        ZSTDb_not_buffered);
}